

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

void drwav_f32_to_s16(drwav_int16 *pOut,float *pIn,size_t sampleCount)

{
  float local_40;
  float local_3c;
  float c;
  float x;
  size_t i;
  int r;
  size_t sampleCount_local;
  float *pIn_local;
  drwav_int16 *pOut_local;
  
  for (_c = 0; _c < sampleCount; _c = _c + 1) {
    local_40 = pIn[_c];
    if (-1.0 <= local_40) {
      if (1.0 < local_40) {
        local_40 = 1.0;
      }
      local_3c = local_40;
    }
    else {
      local_3c = -1.0;
    }
    pOut[_c] = (short)(int)((local_3c + 1.0) * 32767.5) + -0x8000;
  }
  return;
}

Assistant:

void drwav_f32_to_s16(drwav_int16* pOut, const float* pIn, size_t sampleCount) {
    int r;
    for (size_t i = 0; i < sampleCount; ++i) {
        float x = pIn[i];
        float c;
        c = ((x < -1) ? -1 : ((x > 1) ? 1 : x));
        c = c + 1;
        r = (int)(c * 32767.5f);
        r = r - 32768;
        pOut[i] = (short)r;
    }
}